

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall duckdb::BuiltinFunctions::Initialize(BuiltinFunctions *this)

{
  allocator local_3e1;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  ScalarFunction local_380;
  ScalarFunction local_258;
  ScalarFunction local_130;
  
  RegisterTableScanFunctions(this);
  RegisterSQLiteFunctions(this);
  RegisterReadFunctions(this);
  RegisterTableFunctions(this);
  RegisterArrowFunctions(this);
  RegisterPragmaFunctions(this);
  ::std::__cxx11::string::string((string *)&local_3a0,"nocase",&local_3e1);
  LowerFun::GetFunction();
  AddCollation(this,&local_3a0,&local_130,true,false);
  ScalarFunction::~ScalarFunction(&local_130);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  ::std::__cxx11::string::string((string *)&local_3c0,"noaccent",&local_3e1);
  StripAccentsFun::GetFunction();
  AddCollation(this,&local_3c0,&local_258,true,false);
  ScalarFunction::~ScalarFunction(&local_258);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  ::std::__cxx11::string::string((string *)&local_3e0,"nfc",&local_3e1);
  NFCNormalizeFun::GetFunction();
  AddCollation(this,&local_3e0,&local_380,false,false);
  ScalarFunction::~ScalarFunction(&local_380);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  RegisterExtensionOverloads(this);
  return;
}

Assistant:

void BuiltinFunctions::Initialize() {
	RegisterTableScanFunctions();
	RegisterSQLiteFunctions();
	RegisterReadFunctions();
	RegisterTableFunctions();
	RegisterArrowFunctions();

	RegisterPragmaFunctions();

	// initialize collations
	AddCollation("nocase", LowerFun::GetFunction(), true);
	AddCollation("noaccent", StripAccentsFun::GetFunction(), true);
	AddCollation("nfc", NFCNormalizeFun::GetFunction());

	RegisterExtensionOverloads();
}